

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cpp
# Opt level: O2

vector<FileStatus,_std::allocator<FileStatus>_> *
diffStatus(vector<FileStatus,_std::allocator<FileStatus>_> *__return_storage_ptr__,string *new_dir,
          string *old_dir)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  FileStatus *__return_storage_ptr___00;
  long lVar6;
  ulong uVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_files;
  long local_1c8;
  ulong local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  old_files;
  FileStatus fileStatus;
  string local_150;
  string file2;
  string file1;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->super__Vector_base<FileStatus,_std::allocator<FileStatus>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<FileStatus,_std::allocator<FileStatus>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<FileStatus,_std::allocator<FileStatus>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ls_abi_cxx11_(&new_files,(new_dir->_M_dataplus)._M_p);
  ls_abi_cxx11_(&old_files,(old_dir->_M_dataplus)._M_p);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (new_files.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             new_files.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (old_files.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             old_files.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  local_1c8 = 0;
  iVar5 = 0;
  local_1c0 = 0;
  do {
    uVar7 = (ulong)iVar5;
    local_1c0 = (ulong)(int)local_1c0;
    lVar6 = local_1c0 << 5;
    while( true ) {
      if (((ulong)((long)new_files.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)new_files.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar7) ||
         ((ulong)((long)old_files.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)old_files.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= local_1c0)) {
        for (; uVar7 < (ulong)((long)new_files.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)new_files.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar7 = uVar7 + 1) {
          std::__cxx11::string::string
                    ((string *)&local_150,
                     (string *)
                     ((long)&((new_files.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     local_1c8));
          initFileStatus(&fileStatus,&local_150,added);
          std::__cxx11::string::~string((string *)&local_150);
          std::vector<FileStatus,_std::allocator<FileStatus>_>::push_back
                    (__return_storage_ptr__,&fileStatus);
          std::__cxx11::string::~string((string *)&fileStatus);
          local_1c8 = local_1c8 + 0x20;
        }
        for (; local_1c0 <
               (ulong)((long)old_files.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)old_files.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5);
            local_1c0 = local_1c0 + 1) {
          std::__cxx11::string::string
                    ((string *)&local_f0,
                     (string *)
                     ((long)&((old_files.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6
                     ));
          initFileStatus(&fileStatus,&local_f0,removed);
          std::__cxx11::string::~string((string *)&local_f0);
          std::vector<FileStatus,_std::allocator<FileStatus>_>::push_back
                    (__return_storage_ptr__,&fileStatus);
          std::__cxx11::string::~string((string *)&fileStatus);
          lVar6 = lVar6 + 0x20;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&old_files);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&new_files);
        return __return_storage_ptr__;
      }
      _Var3 = std::operator==(new_files.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar7,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&((old_files.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar6));
      if (_Var3) {
        std::operator+(&fileStatus.filename,new_dir,"/");
        std::operator+(&file1,&fileStatus.filename,
                       new_files.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar7);
        std::__cxx11::string::~string((string *)&fileStatus);
        std::operator+(&fileStatus.filename,old_dir,"/");
        std::operator+(&file2,&fileStatus.filename,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&((old_files.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar6));
        std::__cxx11::string::~string((string *)&fileStatus);
        std::__cxx11::string::string((string *)&local_50,(string *)&file1);
        std::__cxx11::string::string((string *)&local_70,(string *)&file2);
        diff_files((vector<DiffLine,_std::allocator<DiffLine>_> *)&fileStatus,&local_50,&local_70);
        sVar2 = fileStatus.filename._M_string_length;
        _Var1 = fileStatus.filename._M_dataplus;
        std::vector<DiffLine,_std::allocator<DiffLine>_>::~vector
                  ((vector<DiffLine,_std::allocator<DiffLine>_> *)&fileStatus);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        if ((pointer)sVar2 != _Var1._M_p) {
          std::__cxx11::string::string
                    ((string *)&local_90,
                     (string *)
                     (new_files.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar7));
          initFileStatus(&fileStatus,&local_90,modified);
          std::__cxx11::string::~string((string *)&local_90);
          std::vector<FileStatus,_std::allocator<FileStatus>_>::push_back
                    (__return_storage_ptr__,&fileStatus);
          std::__cxx11::string::~string((string *)&fileStatus);
        }
        local_1c0 = (ulong)((int)local_1c0 + 1);
        std::__cxx11::string::~string((string *)&file2);
        __return_storage_ptr___00 = (FileStatus *)&file1;
        goto LAB_00106467;
      }
      bVar4 = std::operator>(new_files.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar7,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&((old_files.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar6));
      if (!bVar4) break;
      std::__cxx11::string::string
                ((string *)&local_b0,
                 (string *)
                 ((long)&((old_files.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6));
      initFileStatus(&fileStatus,&local_b0,removed);
      std::__cxx11::string::~string((string *)&local_b0);
      std::vector<FileStatus,_std::allocator<FileStatus>_>::push_back
                (__return_storage_ptr__,&fileStatus);
      std::__cxx11::string::~string((string *)&fileStatus);
      lVar6 = lVar6 + 0x20;
      local_1c0 = local_1c0 + 1;
    }
    std::__cxx11::string::string
              ((string *)&local_d0,
               (string *)
               (new_files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar7));
    __return_storage_ptr___00 = &fileStatus;
    initFileStatus(__return_storage_ptr___00,&local_d0,added);
    std::__cxx11::string::~string((string *)&local_d0);
    std::vector<FileStatus,_std::allocator<FileStatus>_>::push_back
              (__return_storage_ptr__,__return_storage_ptr___00);
LAB_00106467:
    std::__cxx11::string::~string((string *)__return_storage_ptr___00);
    iVar5 = iVar5 + 1;
    local_1c8 = local_1c8 + 0x20;
  } while( true );
}

Assistant:

Vector<FileStatus> diffStatus(String new_dir,String old_dir){
    Vector<FileStatus> result;
    Vector<String> new_files = ls(new_dir.c_str());
    Vector<String> old_files = ls(old_dir.c_str());
    sort(new_files.begin(),new_files.end());
    sort(old_files.begin(),old_files.end());
    int i = 0;
    int j = 0;
    while(i < new_files.size() && j < old_files.size()){
        if(new_files[i] == old_files[j]){
            String file1 = new_dir + "/" + new_files[i];
            String file2 = old_dir + "/" + old_files[j];
            if(diff_files(file1,file2).size()>0){
                FileStatus fileStatus = initFileStatus(new_files[i],modified);
                result.push_back(fileStatus);
            }
            i++;
            j++;
        }
        else{
            if(new_files[i] > old_files[j]){
                FileStatus fileStatus = initFileStatus(old_files[j],removed);
                result.push_back(fileStatus);
                j++;
            }
            else{
                FileStatus fileStatus = initFileStatus(new_files[i],added);
                result.push_back(fileStatus);
                i++;
            }
        }
    }
    while(i < new_files.size()){
        FileStatus fileStatus = initFileStatus(new_files[i],added);
        result.push_back(fileStatus);
        i++;
    }
    while(j < old_files.size()){
        FileStatus fileStatus = initFileStatus(old_files[j],removed);
        result.push_back(fileStatus);
        j++;
    }
    return result;
}